

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

IceTUByte * icetImageGetColorcub(IceTImage image)

{
  IceTEnum IVar1;
  IceTEnum color_format;
  IceTImage image_local;
  
  IVar1 = icetImageGetColorFormat(image);
  if (IVar1 == 0xc001) {
    image_local.opaque_internals = icetImageGetColorConstVoid(image,(IceTSizeType *)0x0);
  }
  else {
    icetRaiseDiagnostic("Color format is not of type ubyte.",0xfffffffb,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                        ,0x292);
    image_local.opaque_internals = (IceTVoid *)0x0;
  }
  return (IceTUByte *)image_local.opaque_internals;
}

Assistant:

const IceTUByte *icetImageGetColorcub(const IceTImage image)
{
    IceTEnum color_format = icetImageGetColorFormat(image);

    if (color_format != ICET_IMAGE_COLOR_RGBA_UBYTE) {
        icetRaiseError("Color format is not of type ubyte.",
                       ICET_INVALID_OPERATION);
        return NULL;
    }

    return icetImageGetColorConstVoid(image, NULL);
}